

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

target_ulong helper_lar_x86_64(CPUX86State *env,target_ulong selector1)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uintptr_t unaff_retaddr;
  int type;
  int cpl;
  int dpl;
  int rpl;
  uint32_t selector;
  uint32_t eflags;
  uint32_t e2;
  uint32_t e1;
  target_ulong selector1_local;
  CPUX86State *env_local;
  
  _e2 = selector1;
  selector1_local = (target_ulong)env;
  uVar1 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  if (((selector1 & 0xfffc) != 0) &&
     (iVar2 = load_segment_ra((CPUX86State *)selector1_local,&eflags,&selector,
                              (uint)selector1 & 0xffff,unaff_retaddr), iVar2 == 0)) {
    uVar3 = selector >> 0xd & 3;
    if ((selector & 0x1000) == 0) {
      uVar4 = selector >> 8 & 0xf;
      if ((4 < uVar4 - 1) && ((uVar4 != 9 && (uVar4 != 0xb && uVar4 != 0xc)))) goto LAB_0053dfd3;
    }
    else if (((selector & 0x800) != 0) && ((selector & 0x400) != 0)) goto LAB_0053dff4;
    if (((*(uint *)(selector1_local + 0xb0) & 3) <= uVar3) && (((uint)selector1 & 3) <= uVar3)) {
LAB_0053dff4:
      *(ulong *)(selector1_local + 0x98) = (ulong)(uVar1 | 0x40);
      return (ulong)(selector & 0xf0ff00);
    }
  }
LAB_0053dfd3:
  *(ulong *)(selector1_local + 0x98) = (ulong)(uVar1 & 0xffffffbf);
  return 0;
}

Assistant:

target_ulong helper_lar(CPUX86State *env, target_ulong selector1)
{
    uint32_t e1, e2, eflags, selector;
    int rpl, dpl, cpl, type;

    selector = selector1 & 0xffff;
    eflags = cpu_cc_compute_all(env, CC_OP);
    if ((selector & 0xfffc) == 0) {
        goto fail;
    }
    if (load_segment_ra(env, &e1, &e2, selector, GETPC()) != 0) {
        goto fail;
    }
    rpl = selector & 3;
    dpl = (e2 >> DESC_DPL_SHIFT) & 3;
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if ((e2 & DESC_CS_MASK) && (e2 & DESC_C_MASK)) {
            /* conforming */
        } else {
            if (dpl < cpl || dpl < rpl) {
                goto fail;
            }
        }
    } else {
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        switch (type) {
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 9:
        case 11:
        case 12:
            break;
        default:
            goto fail;
        }
        if (dpl < cpl || dpl < rpl) {
        fail:
            CC_SRC = eflags & ~CC_Z;
            return 0;
        }
    }
    CC_SRC = eflags | CC_Z;
    return e2 & 0x00f0ff00;
}